

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O0

ScalarFunction * duckdb::ListAggregateFun::GetFunction(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  ScalarFunction *in_RDI;
  ScalarFunction *result;
  allocator_type *in_stack_fffffffffffffdc8;
  LogicalType *function;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffdd0;
  code *this;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  LogicalType *local_1d0;
  LogicalType local_1b0 [24];
  BaseScalarFunction local_198 [176];
  LogicalType local_e8 [24];
  undefined1 local_d0 [32];
  LogicalType local_b0 [27];
  undefined1 local_95;
  LogicalType local_88 [24];
  LogicalType *local_70;
  LogicalType local_68 [24];
  LogicalType local_50 [24];
  LogicalType *local_38;
  undefined8 local_30;
  undefined1 local_28 [31];
  undefined1 local_9;
  
  local_9 = 0;
  local_95 = 1;
  local_70 = local_68;
  duckdb::LogicalType::LogicalType(local_88,ANY);
  duckdb::LogicalType::LIST(local_68);
  local_70 = local_50;
  duckdb::LogicalType::LogicalType(local_70,VARCHAR);
  local_95 = 0;
  local_38 = local_68;
  local_30 = 2;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xd5021c);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffde0;
  iVar1._M_array = (iterator)in_stack_fffffffffffffdd8;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffde4;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffdd0,iVar1,in_stack_fffffffffffffdc8);
  duckdb::LogicalType::LogicalType(local_b0,ANY);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),in_stack_fffffffffffffdd8
            );
  duckdb::LogicalType::LogicalType(local_e8,INVALID);
  this = ListAggregatesInitLocalState;
  function = (LogicalType *)0x0;
  duckdb::ScalarFunction::ScalarFunction
            (in_RDI,local_28,local_b0,local_d0,ListAggregateBind,0,0,ListAggregatesInitLocalState,
             local_e8,0,0,0);
  duckdb::LogicalType::~LogicalType(local_e8);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xd502fa);
  duckdb::LogicalType::~LogicalType(local_b0);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xd50314);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xd50321);
  local_1d0 = (LogicalType *)&local_38;
  do {
    local_1d0 = local_1d0 + -0x18;
    duckdb::LogicalType::~LogicalType(local_1d0);
  } while (local_1d0 != local_68);
  duckdb::LogicalType::~LogicalType(local_88);
  BaseScalarFunction::SetReturnsError((BaseScalarFunction *)function);
  duckdb::BaseScalarFunction::~BaseScalarFunction(local_198);
  in_RDI->field_0xa9 = 1;
  duckdb::LogicalType::LogicalType(local_1b0,ANY);
  LogicalType::operator=((LogicalType *)this,function);
  duckdb::LogicalType::~LogicalType(local_1b0);
  in_RDI->serialize = ListAggregatesBindData::SerializeFunction;
  in_RDI->deserialize = ListAggregatesBindData::DeserializeFunction;
  return in_RDI;
}

Assistant:

ScalarFunction ListAggregateFun::GetFunction() {
	auto result =
	    ScalarFunction({LogicalType::LIST(LogicalType::ANY), LogicalType::VARCHAR}, LogicalType::ANY,
	                   ListAggregateFunction, ListAggregateBind, nullptr, nullptr, ListAggregatesInitLocalState);
	BaseScalarFunction::SetReturnsError(result);
	result.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	result.varargs = LogicalType::ANY;
	result.serialize = ListAggregatesBindData::SerializeFunction;
	result.deserialize = ListAggregatesBindData::DeserializeFunction;
	return result;
}